

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_block.cpp
# Opt level: O1

void __thiscall
spvtools::opt::BasicBlock::ForEachSuccessorLabel(BasicBlock *this,function<void_(unsigned_int)> *f)

{
  _Manager_type p_Var1;
  _Any_data *p_Var2;
  _Any_data local_58;
  _Manager_type local_48;
  _Invoker_type p_Stack_40;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  local_48 = (_Manager_type)0x0;
  p_Stack_40 = (_Invoker_type)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  p_Var1 = (f->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)(&local_58,(_Any_data *)f,__clone_functor);
    p_Stack_40 = f->_M_invoker;
    local_48 = (f->super__Function_base)._M_manager;
  }
  local_28 = (code *)0x0;
  pcStack_20 = (code *)0x0;
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  p_Var2 = (_Any_data *)operator_new(0x20);
  *(undefined8 *)p_Var2 = 0;
  *(char *)((long)p_Var2 + 8) = '\0';
  *(char *)((long)p_Var2 + 9) = '\0';
  *(char *)((long)p_Var2 + 10) = '\0';
  *(char *)((long)p_Var2 + 0xb) = '\0';
  *(char *)((long)p_Var2 + 0xc) = '\0';
  *(char *)((long)p_Var2 + 0xd) = '\0';
  *(char *)((long)p_Var2 + 0xe) = '\0';
  *(char *)((long)p_Var2 + 0xf) = '\0';
  *(char *)((long)p_Var2 + 0x10) = '\0';
  *(char *)((long)p_Var2 + 0x11) = '\0';
  *(char *)((long)p_Var2 + 0x12) = '\0';
  *(char *)((long)p_Var2 + 0x13) = '\0';
  *(char *)((long)p_Var2 + 0x14) = '\0';
  *(char *)((long)p_Var2 + 0x15) = '\0';
  *(char *)((long)p_Var2 + 0x16) = '\0';
  *(char *)((long)p_Var2 + 0x17) = '\0';
  *(char *)((long)p_Var2 + 0x18) = '\0';
  *(char *)((long)p_Var2 + 0x19) = '\0';
  *(char *)((long)p_Var2 + 0x1a) = '\0';
  *(char *)((long)p_Var2 + 0x1b) = '\0';
  *(char *)((long)p_Var2 + 0x1c) = '\0';
  *(char *)((long)p_Var2 + 0x1d) = '\0';
  *(char *)((long)p_Var2 + 0x1e) = '\0';
  *(char *)((long)p_Var2 + 0x1f) = '\0';
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)(p_Var2,&local_58,__clone_functor);
    *(_Invoker_type *)(p_Var2->_M_pod_data + 0x18) = p_Stack_40;
    *(_Manager_type *)(p_Var2->_M_pod_data + 0x10) = local_48;
  }
  pcStack_20 = std::
               _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.cpp:107:27)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.cpp:107:27)>
             ::_M_manager;
  local_38._M_unused._0_8_ = p_Var2;
  WhileEachSuccessorLabel(this,(function<bool_(unsigned_int)> *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  return;
}

Assistant:

void BasicBlock::ForEachSuccessorLabel(
    const std::function<void(const uint32_t)>& f) const {
  WhileEachSuccessorLabel([f](const uint32_t l) {
    f(l);
    return true;
  });
}